

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_mulldo(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 rl;
  TCGv_i64 rh;
  uintptr_t o;
  uintptr_t o_1;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  rl = tcg_temp_new_i64(tcg_ctx);
  rh = tcg_temp_new_i64(tcg_ctx);
  tcg_gen_muls2_i64_ppc64
            (tcg_ctx,rl,rh,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0xd & 0xf8)),
             *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 8 & 0xf8)));
  tcg_gen_mov_i64_ppc64
            (tcg_ctx,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8)),rl);
  tcg_gen_sari_i64_ppc64(tcg_ctx,rl,rl,0x3f);
  tcg_gen_setcond_i64_ppc64(tcg_ctx,TCG_COND_NE,cpu_ov,rl,rh);
  if ((ctx->insns_flags2 & 0x80000) != 0) {
    tcg_gen_mov_i64_ppc64(tcg_ctx,cpu_ov32,cpu_ov);
  }
  tcg_gen_or_i64_ppc64(tcg_ctx,cpu_so,cpu_so,cpu_ov);
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(rl + (long)tcg_ctx));
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(rh + (long)tcg_ctx));
  if ((ctx->opcode & 1) == 0) {
    return;
  }
  gen_set_Rc0(ctx,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8)));
  return;
}

Assistant:

static void gen_mulldo(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);

    tcg_gen_muls2_i64(tcg_ctx, t0, t1, cpu_gpr[rA(ctx->opcode)],
                      cpu_gpr[rB(ctx->opcode)]);
    tcg_gen_mov_i64(tcg_ctx, cpu_gpr[rD(ctx->opcode)], t0);

    tcg_gen_sari_i64(tcg_ctx, t0, t0, 63);
    tcg_gen_setcond_i64(tcg_ctx, TCG_COND_NE, cpu_ov, t0, t1);
    if (is_isa300(ctx)) {
        tcg_gen_mov_tl(tcg_ctx, cpu_ov32, cpu_ov);
    }
    tcg_gen_or_tl(tcg_ctx, cpu_so, cpu_so, cpu_ov);

    tcg_temp_free_i64(tcg_ctx, t0);
    tcg_temp_free_i64(tcg_ctx, t1);

    if (unlikely(Rc(ctx->opcode) != 0)) {
        gen_set_Rc0(ctx, cpu_gpr[rD(ctx->opcode)]);
    }
}